

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_test.cpp
# Opt level: O0

void __thiscall
check_if_boundary_of_boundary_is_zero_periodic_case_2d::test_method
          (check_if_boundary_of_boundary_is_zero_periodic_case_2d *this)

{
  allocator<bool> *this_00;
  allocator<double> *this_01;
  allocator<int> *this_02;
  value_type vVar1;
  undefined8 uVar2;
  type_conflict1 tVar3;
  bool bVar4;
  int iVar5;
  reference pvVar6;
  size_type sVar7;
  ostream *poVar8;
  reference puVar9;
  void *this_03;
  reference puVar10;
  size_type sVar11;
  reference pvVar12;
  lazy_ostream *prev;
  basic_cstring<const_char> local_250;
  basic_cstring<const_char> local_240;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_230;
  assertion_result local_210;
  basic_cstring<const_char> local_1f8;
  basic_cstring<const_char> local_1e8;
  size_type local_1d8;
  size_t i_1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1c8;
  iterator bd2;
  undefined1 local_1b8 [4];
  int j;
  Boundary_range second_bdrange;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_198;
  iterator bd;
  Boundary_range bdrange;
  undefined1 local_170 [4];
  int i;
  undefined1 local_168 [8];
  All_cells_iterator it;
  Bitmap_cubical_complex_periodic_boundary_conditions ba;
  undefined1 local_b0 [8];
  vector<int,_std::allocator<int>_> elems_in_boundary;
  int number_of_all_elements;
  undefined1 local_88 [8];
  vector<double,_std::allocator<double>_> data;
  undefined1 local_68 [8];
  vector<bool,_std::allocator<bool>_> directions_of_periodicity;
  allocator<unsigned_int> local_29;
  undefined1 local_28 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> sizes;
  check_if_boundary_of_boundary_is_zero_periodic_case_2d *this_local;
  
  sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_int>::allocator(&local_29);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,2,&local_29);
  std::allocator<unsigned_int>::~allocator(&local_29);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,0);
  *pvVar6 = 3;
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,1);
  *pvVar6 = 3;
  data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 1;
  this_00 = (allocator<bool> *)
            ((long)&data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 6);
  std::allocator<bool>::allocator(this_00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_68,2,
             (bool *)((long)&data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 7),this_00);
  std::allocator<bool>::~allocator
            ((allocator<bool> *)
             ((long)&data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 6));
  _number_of_all_elements = 0.0;
  this_01 = (allocator<double> *)
            ((long)&elems_in_boundary.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<double>::allocator(this_01);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_88,9,
             (value_type_conflict2 *)&number_of_all_elements,this_01);
  std::allocator<double>::~allocator
            ((allocator<double> *)
             ((long)&elems_in_boundary.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,0);
  vVar1 = *pvVar6;
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,1);
  elems_in_boundary.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = *pvVar6 * vVar1 * 4;
  sVar7 = (size_type)
          (int)elems_in_boundary.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  ba.sorted_cells.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  this_02 = (allocator<int> *)
            ((long)&ba.sorted_cells.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(this_02);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_b0,sVar7,
             (value_type_conflict4 *)
             ((long)&ba.sorted_cells.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4),this_02);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&ba.sorted_cells.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3));
  Gudhi::cubical_complex::
  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_periodic_boundary_conditions_base<double>_>
  ::Bitmap_cubical_complex
            ((Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_periodic_boundary_conditions_base<double>_>
              *)&it,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,
             (vector<double,_std::allocator<double>_> *)local_88,
             (vector<bool,_std::allocator<bool>_> *)local_68,true);
  Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::all_cells_iterator_begin
            ((Bitmap_cubical_complex_base<double> *)local_168);
  while( true ) {
    Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::all_cells_iterator_end
              ((Bitmap_cubical_complex_base<double> *)local_170);
    tVar3 = boost::iterators::operator!=
                      ((iterator_facade<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_const_unsigned_long_&,_long>
                        *)local_168,
                       (iterator_facade<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_const_unsigned_long_&,_long>
                        *)local_170);
    if (!tVar3) break;
    bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    poVar8 = std::operator<<((ostream *)&std::clog,"Element : ");
    puVar9 = boost::iterators::detail::
             iterator_facade_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_const_unsigned_long_&,_long,_false,_false>
             ::operator*((iterator_facade_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_const_unsigned_long_&,_long,_false,_false>
                          *)local_168);
    this_03 = (void *)std::ostream::operator<<(poVar8,*puVar9);
    std::ostream::operator<<(this_03,std::endl<char,std::char_traits<char>>);
    puVar9 = boost::iterators::detail::
             iterator_facade_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_const_unsigned_long_&,_long,_false,_false>
             ::operator*((iterator_facade_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_const_unsigned_long_&,_long,_false,_false>
                          *)local_168);
    Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::boundary_range
              ((Boundary_range *)&bd,(Bitmap_cubical_complex_base<double> *)&it,*puVar9);
    local_198._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&bd);
    while( true ) {
      second_bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&bd);
      bVar4 = __gnu_cxx::operator!=
                        (&local_198,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&second_bdrange.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar4) break;
      puVar10 = __gnu_cxx::
                __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator*(&local_198);
      poVar8 = (ostream *)std::ostream::operator<<(&std::clog,*puVar10);
      std::operator<<(poVar8," ");
      puVar10 = __gnu_cxx::
                __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::operator*(&local_198);
      Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::boundary_range
                ((Boundary_range *)local_1b8,(Bitmap_cubical_complex_base<double> *)&it,*puVar10);
      bd2._M_current._4_4_ = 1;
      local_1c8._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8);
      while( true ) {
        i_1 = (size_t)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8)
        ;
        bVar4 = __gnu_cxx::operator!=
                          (&local_1c8,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)&i_1);
        if (!bVar4) break;
        iVar5 = bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ * bd2._M_current._4_4_;
        puVar10 = __gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator*(&local_1c8);
        pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)local_b0,*puVar10);
        *pvVar12 = iVar5 + *pvVar12;
        bd2._M_current._4_4_ = -bd2._M_current._4_4_;
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_1c8);
      }
      bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           -bdrange.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_198);
    }
    for (local_1d8 = 0; sVar7 = local_1d8,
        sVar11 = std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)local_b0), sVar7 != sVar11;
        local_1d8 = local_1d8 + 1) {
      do {
        uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
                   ,0x75);
        boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1f8);
        boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_1e8,0x46a,&local_1f8);
        pvVar12 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)local_b0,local_1d8);
        boost::test_tools::assertion_result::assertion_result(&local_210,*pvVar12 == 0);
        prev = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_240,"elems_in_boundary[i] == 0",0x19);
        boost::unit_test::operator<<(&local_230,prev,&local_240);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_250,
                   "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Bitmap_cubical_complex/test/Bitmap_test.cpp"
                   ,0x75);
        boost::test_tools::tt_detail::report_assertion(&local_210,&local_230,&local_250,0x46a,1,0,0)
        ;
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl(&local_230);
        boost::test_tools::assertion_result::~assertion_result(&local_210);
        bVar4 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar4);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&bd);
    boost::iterators::detail::
    iterator_facade_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_const_unsigned_long_&,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::iterators::counting_iterator<unsigned_long,_boost::use_default,_boost::use_default>,_unsigned_long,_boost::iterators::random_access_traversal_tag,_const_unsigned_long_&,_long,_false,_false>
                  *)local_168);
  }
  Gudhi::cubical_complex::
  Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_periodic_boundary_conditions_base<double>_>
  ::~Bitmap_cubical_complex
            ((Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_periodic_boundary_conditions_base<double>_>
              *)&it);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_b0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_88);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_68)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_if_boundary_of_boundary_is_zero_periodic_case_2d) {
  std::vector<unsigned> sizes(2);
  sizes[0] = 3;
  sizes[1] = 3;

  std::vector<bool> directions_of_periodicity(2, true);
  std::vector<double> data(9, 0);

  int number_of_all_elements = (2 * sizes[0]) * (2 * sizes[1]);  // *(2*sizes[2]);
  std::vector<int> elems_in_boundary(number_of_all_elements, 0);
  Bitmap_cubical_complex_periodic_boundary_conditions ba(sizes, data, directions_of_periodicity);
  for (auto it = ba.all_cells_iterator_begin();
       it != ba.all_cells_iterator_end(); ++it) {    
    int i = 1;
    std::clog << "Element : " << *it << std::endl;
    Bitmap_cubical_complex_periodic_boundary_conditions_base::Boundary_range bdrange = ba.boundary_range(*it);
    for (auto bd = bdrange.begin();
         bd != bdrange.end(); ++bd) {
      std::clog <<  *bd << " ";
      Bitmap_cubical_complex_periodic_boundary_conditions::Boundary_range second_bdrange = ba.boundary_range(*bd);
      int j = 1;
      for (auto bd2 = second_bdrange.begin();
           bd2 != second_bdrange.end(); ++bd2) {
        elems_in_boundary[*bd2] += i * j;
        j *= -1;
      }
      i *= -1;
    }
    // getchar();

    // check if there is anything nonzero in elems_in_boundary
    for (size_t i = 0; i != elems_in_boundary.size(); ++i) {
      BOOST_CHECK(elems_in_boundary[i] == 0);
    }
  }
}